

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *__s;
  long lVar4;
  int iVar5;
  char *pcVar6;
  stat buf;
  
  unixTempFileDir_azDirs = sqlite3_temp_directory;
  if (DAT_001bd998 == (char *)0x0) {
    DAT_001bd998 = getenv("TMPDIR");
  }
  lVar4 = 0;
  pcVar6 = (char *)0x0;
  while ((lVar4 != 0x30 &&
         ((((pcVar6 == (char *)0x0 || (iVar1 = (*aSyscall[4].pCurrent)(pcVar6,&buf), iVar1 != 0)) ||
           ((buf.st_mode & 0xf000) != 0x4000)) ||
          (iVar1 = (*aSyscall[2].pCurrent)(pcVar6,7), iVar1 != 0))))) {
    pcVar6 = *(char **)((long)&unixTempFileDir_azDirs + lVar4);
    lVar4 = lVar4 + 8;
  }
  __s = ".";
  if (pcVar6 != (char *)0x0) {
    __s = pcVar6;
  }
  sVar2 = strlen(__s);
  if (sVar2 + 0x19 < (ulong)(long)nBuf) {
    iVar1 = 0;
    do {
      sqlite3_snprintf(nBuf + -0x12,zBuf,"%s/etilqs_",__s);
      sVar2 = strlen(zBuf);
      sqlite3_randomness(0xf,zBuf + (sVar2 & 0xffffffff));
      uVar3 = sVar2 & 0xffffffff;
      for (iVar5 = 0; iVar5 != -0xf; iVar5 = iVar5 + -1) {
        zBuf[uVar3] = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"
                      [(byte)zBuf[uVar3] % 0x3e];
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      zBuf[uVar3] = '\0';
      zBuf[(int)sVar2 + 0x10] = '\0';
      iVar5 = (*aSyscall[2].pCurrent)(zBuf,0);
    } while (iVar5 == 0);
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  static const unsigned char zChars[] =
    "abcdefghijklmnopqrstuvwxyz"
    "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
    "0123456789";
  unsigned int i, j;
  const char *zDir;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. 
  */
  SimulateIOError( return SQLITE_IOERR );

  zDir = unixTempFileDir();
  if( zDir==0 ) zDir = ".";

  /* Check that the output buffer is large enough for the temporary file 
  ** name. If it is not, return SQLITE_ERROR.
  */
  if( (strlen(zDir) + strlen(SQLITE_TEMP_FILE_PREFIX) + 18) >= (size_t)nBuf ){
    return SQLITE_ERROR;
  }

  do{
    sqlite3_snprintf(nBuf-18, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX, zDir);
    j = (int)strlen(zBuf);
    sqlite3_randomness(15, &zBuf[j]);
    for(i=0; i<15; i++, j++){
      zBuf[j] = (char)zChars[ ((unsigned char)zBuf[j])%(sizeof(zChars)-1) ];
    }
    zBuf[j] = 0;
    zBuf[j+1] = 0;
  }while( osAccess(zBuf,0)==0 );
  return SQLITE_OK;
}